

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_timer.c
# Opt level: O0

void systime(uint32_t *sec,uint32_t *cs)

{
  undefined1 local_28 [8];
  timespec ti;
  uint32_t *cs_local;
  uint32_t *sec_local;
  
  ti.tv_nsec = (__syscall_slong_t)cs;
  clock_gettime(0,(timespec *)local_28);
  *sec = local_28._0_4_;
  *(int *)ti.tv_nsec = (int)(ti.tv_sec / 10000000);
  return;
}

Assistant:

static void
systime(uint32_t *sec, uint32_t *cs) {
#if !defined(__APPLE__)
	struct timespec ti;
	clock_gettime(CLOCK_REALTIME, &ti);
	*sec = (uint32_t)ti.tv_sec;
	*cs = (uint32_t)(ti.tv_nsec / 10000000);
#else
	struct timeval tv;
	gettimeofday(&tv, NULL);
	*sec = tv.tv_sec;
	*cs = tv.tv_usec / 10000;
#endif
}